

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_secrets.cpp
# Opt level: O2

void duckdb::DuckDBSecretsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  pointer pbVar1;
  CatalogTransaction transaction_00;
  GlobalTableFunctionState *pGVar2;
  FunctionData *pFVar3;
  SecretManager *this;
  reference pvVar4;
  pointer pBVar5;
  type pBVar6;
  _func_int **pp_Var7;
  _func_int **__n;
  _func_int **pp_Var8;
  pointer pbVar9;
  ulong index;
  vector<duckdb::Value,_true> scope_value;
  LogicalType local_188;
  Value local_170;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_130 [24];
  CatalogTransaction transaction;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  pFVar3 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  this = SecretManager::Get(context);
  CatalogTransaction::GetSystemCatalogTransaction(&transaction,context);
  pp_Var8 = pGVar2[2]._vptr_GlobalTableFunctionState;
  pp_Var7 = pGVar2[3]._vptr_GlobalTableFunctionState;
  if (pp_Var8 == pp_Var7) {
    transaction_00.context.ptr = transaction.context.ptr;
    transaction_00.db.ptr = transaction.db.ptr;
    transaction_00.transaction.ptr = transaction.transaction.ptr;
    transaction_00.transaction_id = transaction.transaction_id;
    transaction_00.start_time = transaction.start_time;
    SecretManager::AllSecrets((vector<duckdb::SecretEntry,_true> *)&local_170,this,transaction_00);
    ::std::vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>::_M_move_assign
              ((vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_> *)(pGVar2 + 2),
               &local_170);
    ::std::vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>::~vector
              ((vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_> *)&local_170);
    pp_Var8 = pGVar2[2]._vptr_GlobalTableFunctionState;
    pp_Var7 = pGVar2[3]._vptr_GlobalTableFunctionState;
  }
  __n = pGVar2[1]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var7 - (long)pp_Var8) / 0x30)) {
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var7 - (long)pp_Var8) / 0x30) && (index < 0x800));
        index = index + 1) {
      pvVar4 = vector<duckdb::SecretEntry,_true>::get<true>
                         ((vector<duckdb::SecretEntry,_true> *)(pGVar2 + 2),(size_type)__n);
      scope_value.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      scope_value.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      scope_value.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar5 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(&pvVar4->secret);
      pbVar1 = (pBVar5->prefix_paths).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar9 = (pBVar5->prefix_paths).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1
          ) {
        ::std::__cxx11::string::string((string *)&local_50,(string *)pbVar9);
        Value::Value(&local_170,&local_50);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&scope_value,&local_170)
        ;
        Value::~Value(&local_170);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator*(&pvVar4->secret);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&pBVar6->name);
      Value::Value(&local_170,&local_70);
      DataChunk::SetValue(output,0,index,&local_170);
      Value::~Value(&local_170);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::string((string *)&local_90,(string *)&pBVar6->type);
      Value::Value(&local_170,&local_90);
      DataChunk::SetValue(output,1,index,&local_170);
      Value::~Value(&local_170);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)&pBVar6->provider);
      Value::Value(&local_170,&local_b0);
      DataChunk::SetValue(output,2,index,&local_170);
      Value::~Value(&local_170);
      ::std::__cxx11::string::~string((string *)&local_b0);
      Value::Value(&local_170,pvVar4->persist_type == PERSISTENT);
      DataChunk::SetValue(output,3,index,&local_170);
      Value::~Value(&local_170);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)&pvVar4->storage_mode);
      Value::Value(&local_170,&local_d0);
      DataChunk::SetValue(output,4,index,&local_170);
      Value::~Value(&local_170);
      ::std::__cxx11::string::~string((string *)&local_d0);
      LogicalType::LogicalType(&local_188,VARCHAR);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                (local_130,(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&scope_value);
      Value::LIST(&local_170,&local_188,(vector<duckdb::Value,_true> *)local_130);
      DataChunk::SetValue(output,5,index,&local_170);
      Value::~Value(&local_170);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_130);
      LogicalType::~LogicalType(&local_188);
      (*pBVar6->_vptr_BaseSecret[3])(&local_f0,pBVar6,(ulong)*(byte *)&pFVar3[1]._vptr_FunctionData)
      ;
      Value::Value(&local_170,&local_f0);
      DataChunk::SetValue(output,6,index,&local_170);
      Value::~Value(&local_170);
      ::std::__cxx11::string::~string((string *)&local_f0);
      pGVar2[1]._vptr_GlobalTableFunctionState =
           (_func_int **)((long)pGVar2[1]._vptr_GlobalTableFunctionState + 1);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&scope_value);
      __n = pGVar2[1]._vptr_GlobalTableFunctionState;
      pp_Var8 = pGVar2[2]._vptr_GlobalTableFunctionState;
      pp_Var7 = pGVar2[3]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBSecretsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBSecretsData>();
	auto &bind_data = data_p.bind_data->Cast<DuckDBSecretsBindData>();

	auto &secret_manager = SecretManager::Get(context);

	auto transaction = CatalogTransaction::GetSystemCatalogTransaction(context);

	if (data.secrets.empty()) {
		data.secrets = secret_manager.AllSecrets(transaction);
	}
	auto &secrets = data.secrets;
	if (data.offset >= secrets.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < secrets.size() && count < STANDARD_VECTOR_SIZE) {
		auto &secret_entry = secrets[data.offset];

		vector<Value> scope_value;
		for (const auto &scope_entry : secret_entry.secret->GetScope()) {
			scope_value.push_back(scope_entry);
		}

		const auto &secret = *secret_entry.secret;

		idx_t i = 0;
		// name
		output.SetValue(i++, count, secret.GetName());
		// type
		output.SetValue(i++, count, Value(secret.GetType()));
		// provider
		output.SetValue(i++, count, Value(secret.GetProvider()));
		// persistent
		output.SetValue(i++, count, Value(secret_entry.persist_type == SecretPersistType::PERSISTENT));
		// storage
		output.SetValue(i++, count, Value(secret_entry.storage_mode));
		// scope
		output.SetValue(i++, count, Value::LIST(LogicalType::VARCHAR, scope_value));
		// secret_string
		output.SetValue(i++, count, secret.ToString(bind_data.redact));

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}